

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void I422ToRGB24Row_AVX2(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_rgb24,
                        YuvConstants *yuvconstants,int width)

{
  uint uVar1;
  ulong uVar2;
  int width_00;
  ulong uVar3;
  uint8_t row [8192];
  uint8_t local_2060 [8240];
  
  if (0 < width) {
    uVar2 = (ulong)(uint)width;
    do {
      uVar1 = (uint)uVar2;
      uVar3 = 0x800;
      if (uVar1 < 0x800) {
        uVar3 = uVar2;
      }
      width_00 = (int)uVar3;
      I422ToARGBRow_AVX2(src_y,src_u,src_v,local_2060,yuvconstants,width_00);
      ARGBToRGB24Row_AVX2(local_2060,dst_rgb24,width_00);
      src_y = src_y + uVar3;
      src_u = src_u + (uVar3 >> 1);
      src_v = src_v + (uVar3 >> 1);
      dst_rgb24 = dst_rgb24 + (uint)(width_00 * 3);
      uVar2 = (ulong)(uVar1 - width_00);
    } while (uVar1 - width_00 != 0 && width_00 <= (int)uVar1);
  }
  return;
}

Assistant:

void I422ToRGB24Row_AVX2(const uint8_t* src_y,
                         const uint8_t* src_u,
                         const uint8_t* src_v,
                         uint8_t* dst_rgb24,
                         const struct YuvConstants* yuvconstants,
                         int width) {
  // Row buffer for intermediate ARGB pixels.
  SIMD_ALIGNED(uint8_t row[MAXTWIDTH * 4]);
  while (width > 0) {
    int twidth = width > MAXTWIDTH ? MAXTWIDTH : width;
    I422ToARGBRow_AVX2(src_y, src_u, src_v, row, yuvconstants, twidth);
#if defined(HAS_ARGBTORGB24ROW_AVX2)
    ARGBToRGB24Row_AVX2(row, dst_rgb24, twidth);
#else
    ARGBToRGB24Row_SSSE3(row, dst_rgb24, twidth);
#endif
    src_y += twidth;
    src_u += twidth / 2;
    src_v += twidth / 2;
    dst_rgb24 += twidth * 3;
    width -= twidth;
  }
}